

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O3

void __thiscall
QPDFArgParser::addOptionsToCompletions(QPDFArgParser *this,option_table_t *option_table)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_node_base *__rhs;
  int iVar2;
  _Base_ptr p_Var3;
  element_type *peVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string base;
  string local_80;
  QPDFArgParser *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  option_table_t *local_38;
  
  p_Var3 = (option_table->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(option_table->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var3 != p_Var1) {
    local_60 = this;
    local_38 = option_table;
    do {
      __rhs = p_Var3 + 1;
      iVar2 = std::__cxx11::string::compare((char *)__rhs);
      if (iVar2 != 0) {
        std::operator+(&local_58,"--",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
        if (p_Var3[6]._M_parent != (_Base_ptr)0x0) {
          peVar4 = (local_60->m).
                   super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (peVar4->zsh_completion == true) {
            local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_80,local_58._M_dataplus._M_p,
                       local_58._M_dataplus._M_p + local_58._M_string_length);
            std::__cxx11::string::append((char *)&local_80);
            addChoicesToCompletions(local_60,local_38,(string *)__rhs,&local_80);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_80._M_dataplus._M_p != &local_80.field_2) {
              operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
            }
            peVar4 = (local_60->m).
                     super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_80,local_58._M_dataplus._M_p,
                     local_58._M_dataplus._M_p + local_58._M_string_length);
          std::__cxx11::string::append((char *)&local_80);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&peVar4->completions,&local_80);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_80._M_dataplus._M_p != &local_80.field_2) {
            operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          }
        }
        if ((char)p_Var3[2]._M_color == _S_red) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&((local_60->m).
                          super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_ptr)->completions,&local_58);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while ((_Rb_tree_header *)p_Var3 != p_Var1);
  }
  return;
}

Assistant:

void
QPDFArgParser::addOptionsToCompletions(option_table_t& option_table)
{
    for (auto& iter: option_table) {
        std::string const& arg = iter.first;
        if (arg == "--") {
            continue;
        }
        OptionEntry& oe = iter.second;
        std::string base = "--" + arg;
        if (oe.param_arg_handler) {
            if (m->zsh_completion) {
                // zsh doesn't treat = as a word separator, so add all the options so we don't get a
                // space after the =.
                addChoicesToCompletions(option_table, arg, base + "=");
            }
            m->completions.insert(base + "=");
        }
        if (!oe.parameter_needed) {
            m->completions.insert(base);
        }
    }
}